

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleServer.cpp
# Opt level: O3

void __thiscall
CustomServer::on_message
          (CustomServer *this,shared_ptr<blcl::net::connection<MsgType>_> *client,
          message<MsgType> *msg)

{
  MsgType MVar1;
  uint32_t uVar2;
  pointer puVar3;
  pointer puVar4;
  size_t in_RCX;
  int in_R8D;
  shared_ptr<blcl::net::connection<MsgType>_> local_38;
  
  MVar1 = (msg->header).id;
  if (MVar1 == MessageAll) {
    (msg->header).id = ServerMessage;
    uVar2 = ((client->super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr)->id_;
    puVar3 = (msg->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar4 = (msg->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&msg->body,(size_type)(puVar3 + (4 - (long)puVar4)));
    *(uint32_t *)
     (puVar3 + ((long)(msg->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start - (long)puVar4)) = uVar2;
    (msg->header).size =
         *(int *)&(msg->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
         *(int *)&(msg->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_38.super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (client->super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    local_38.super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (client->super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_38.super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_38.
              super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_38.super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_38.
              super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    blcl::net::server_interface<MsgType>::broadcast_message
              (&this->super_server_interface<MsgType>,msg,&local_38);
    if (local_38.super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.
                 super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else if (MVar1 == ServerPing) {
    blcl::net::connection<MsgType>::send
              ((client->
               super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,(int)msg,msg,in_RCX,in_R8D);
    return;
  }
  return;
}

Assistant:

void on_message(std::shared_ptr<blcl::net::connection<MsgType>> client, blcl::net::message<MsgType>& msg) override {
        switch (msg.header.id) {
            case MsgType::ServerPing: {
                //std::cout << "[INFO] " << client->get_id() << ": Server Ping" << std::endl;
                client->send(msg);
                break;
            }
            case MsgType::MessageAll: {
               // std::cout << "[INFO] [" << std::chrono::system_clock::now().time_since_epoch().count() << "] " << client->get_id() << ": Broadcast\n";
//                blcl::net::message<MsgType> msg;
                msg.header.id = MsgType::ServerMessage;
                msg << client->get_id();
                broadcast_message(msg, client);
            }
        }
    }